

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::setTextureSize
          (ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this,uint32_t sizeX_,
          uint32_t sizeY_,uint32_t sizeZ_)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  string *unaff_retaddr;
  allocator local_39;
  string local_38 [36];
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  if (*(int *)(in_RDI + 0x90) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"managed buffer can only be set as texture once",&local_39);
    exception(unaff_retaddr);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  *(undefined4 *)(in_RDI + 0x90) = 3;
  *(undefined4 *)(in_RDI + 0x94) = local_c;
  *(undefined4 *)(in_RDI + 0x98) = local_10;
  *(undefined4 *)(in_RDI + 0x9c) = local_14;
  return;
}

Assistant:

void ManagedBuffer<T>::setTextureSize(uint32_t sizeX_, uint32_t sizeY_, uint32_t sizeZ_) {
  if (deviceBufferType != DeviceBufferType::Attribute) exception("managed buffer can only be set as texture once");

  deviceBufferType = DeviceBufferType::Texture3d;
  sizeX = sizeX_;
  sizeY = sizeY_;
  sizeZ = sizeZ_;
}